

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void clunk::ClearKingDirs<true>(int from)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x281,"void clunk::ClearKingDirs(const int) [color = true]");
  }
  uVar4 = (ulong)(uint)from;
  if ((&_queenKing)[uVar4] != 0) {
    uVar3 = (&_queenKing)[uVar4];
    do {
      if ((uVar3 & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x283,"void clunk::ClearKingDirs(const int) [color = true]");
      }
      uVar6 = (int)(uVar3 & 0xff) - 1;
      if ((uVar6 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x107,"int clunk::Direction(const int, const int)");
      }
      bVar1 = (&_dir)[(ulong)uVar6 + uVar4 * 0x80];
      if (((0x11 < bVar1) || ((0x38002U >> (bVar1 & 0x1f) & 1) == 0)) &&
         ((0x10 < bVar1 - 0xef || ((0x10007U >> (bVar1 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(dir)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x286,"void clunk::ClearKingDirs(const int) [color = true]");
      }
      iVar7 = (int)(char)bVar1;
      uVar5 = iVar7 + from;
      if ((uVar5 & 0xffffff88) != 0) {
LAB_001292cd:
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x288,"void clunk::ClearKingDirs(const int) [color = true]");
      }
      uVar8 = from + iVar7 * 2;
      while( true ) {
        if ((&_dir)[(ulong)uVar5 + uVar4 * 0x80] != bVar1) {
          __assert_fail("Direction(from, to) == dir",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x289,"void clunk::ClearKingDirs(const int) [color = true]");
        }
        if ((_kingDir[uVar5 + 8] == '\0') || (_kingDir[uVar5 + 8] = 0, uVar6 == uVar5)) break;
        uVar5 = uVar5 + iVar7;
        uVar2 = uVar8 & 0xffffff88;
        uVar8 = uVar8 + iVar7;
        if (uVar2 != 0) goto LAB_001292cd;
      }
      bVar9 = 0xff < uVar3;
      uVar3 = uVar3 >> 8;
    } while (bVar9);
  }
  return;
}

Assistant:

void ClearKingDirs(const int from) {
  assert(IS_SQUARE(from));
  for (uint64_t mvs = _queenKing[from]; mvs; mvs >>= 8) {
    assert(mvs & 0xFF);
    const int end = ((mvs & 0xFF) - 1);
    const int dir = Direction(from, end);
    assert(IS_DIR(dir));
    for (int to = (from + dir);; to += dir) {
      assert(IS_SQUARE(to));
      assert(Direction(from, to) == dir);
      if (_kingDir[to + (color * 8)]) {
        _kingDir[to + (color * 8)] = 0;
      }
      else {
        break;
      }
      if (to == end) {
        break;
      }
    }
  }
}